

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger *nparams,
                          SQUnsignedInteger *nfreevars)

{
  SQClosure *pSVar1;
  SQFunctionProto *pSVar2;
  SQObjectPtr *pSVar3;
  SQNativeClosure *c_1;
  SQFunctionProto *proto;
  SQClosure *c;
  SQObject o;
  SQUnsignedInteger *nfreevars_local;
  SQUnsignedInteger *nparams_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar3 = stack_get(v,idx);
  pSVar1 = (pSVar3->super_SQObject)._unVal.pClosure;
  c._0_4_ = (int)*(undefined8 *)&pSVar3->super_SQObject;
  if ((int)c == 0x8000100) {
    pSVar2 = pSVar1->_function;
    *nparams = pSVar2->_nparameters;
    *nfreevars = pSVar2->_noutervalues;
    v_local = (HSQUIRRELVM)0x0;
  }
  else if ((int)c == 0x8000200) {
    *nparams = (SQUnsignedInteger)pSVar1->_env;
    *nfreevars = (SQUnsignedInteger)pSVar1->_defaultparams;
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"the object is not a closure");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger *nparams,SQUnsignedInteger *nfreevars)
{
    SQObject o = stack_get(v, idx);
    if(type(o) == OT_CLOSURE) {
        SQClosure *c = _closure(o);
        SQFunctionProto *proto = c->_function;
        *nparams = (SQUnsignedInteger)proto->_nparameters;
        *nfreevars = (SQUnsignedInteger)proto->_noutervalues;
        return SQ_OK;
    }
    else if(type(o) == OT_NATIVECLOSURE)
    {
        SQNativeClosure *c = _nativeclosure(o);
        *nparams = (SQUnsignedInteger)c->_nparamscheck;
        *nfreevars = c->_noutervalues;
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a closure"));
}